

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O2

atf_error_t atf_tc_set_md_var(atf_tc_t *tc,char *key,char *value,...)

{
  size_t *psVar1;
  atf_tc_impl_s_ *paVar2;
  size_t sVar3;
  int iVar4;
  size_t __n;
  atf_error_t paVar5;
  size_t sVar6;
  
  __n = strlen(key);
  paVar2 = tc->impl_;
  sVar3 = paVar2->variables_size;
  sVar6 = 0;
  do {
    if (sVar3 == sVar6) {
      if (sVar3 == 0x80) {
        paVar5 = (atf_error_t)0x4;
      }
      else {
        paVar2->variables_key[sVar3] = key;
        tc->impl_->variables_value[tc->impl_->variables_size] = value;
        psVar1 = &tc->impl_->variables_size;
        *psVar1 = *psVar1 + 1;
LAB_001012ca:
        paVar5 = (atf_error_t)0x0;
      }
      return paVar5;
    }
    iVar4 = strncmp(paVar2->variables_key[sVar6],key,__n);
    if (iVar4 == 0) {
      paVar2->variables_value[sVar6] = value;
      goto LAB_001012ca;
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

atf_error_t
atf_tc_set_md_var(atf_tc_t *tc, char const *key, char const *value, ...)
{
	size_t key_length = strlen(key);

	for (size_t i = 0; i < tc->impl_->variables_size; ++i) {
		if (strncmp(tc->impl_->variables_key[i], /**/
			key, key_length) == 0) {
			tc->impl_->variables_value[i] = value;
			return atf_no_error();
		}
	}

	if (tc->impl_->variables_size == 128) {
		return microatf_error_too_many_variables();
	}

	tc->impl_->variables_key[tc->impl_->variables_size] = key;
	tc->impl_->variables_value[tc->impl_->variables_size] = value;

	++tc->impl_->variables_size;

	return atf_no_error();
}